

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O2

void __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
updateFnArray(APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
              *this,int lnForNode,int node,int currentSubtreePreL)

{
  int *piVar1;
  pointer piVar2;
  
  if (lnForNode < currentSubtreePreL) {
    piVar2 = (this->fn_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = (this->fn_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
  }
  else {
    piVar2 = (this->fn_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = piVar2 + lnForNode;
  }
  piVar2[node] = *piVar1;
  *piVar1 = node;
  return;
}

Assistant:

void APTEDTreeIndex<CostModel, TreeIndex>::updateFnArray(int lnForNode,
    int node, int currentSubtreePreL) {
  if (lnForNode >= currentSubtreePreL) {
    fn_[node] = fn_[lnForNode];
    fn_[lnForNode] = node;
  } else {
    fn_[node] = fn_[fn_.size() - 1];
    fn_[fn_.size() - 1] = node;
  }
}